

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_0::ValueProductMapKeyComparator::IsMatch
          (ValueProductMapKeyComparator *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  FieldDescriptor *field;
  int iVar4;
  int i;
  int iVar5;
  string_view name;
  Metadata MVar6;
  Metadata MVar7;
  Metadata MVar8;
  
  MVar6 = Message::GetMetadata(message1);
  MVar7 = Message::GetMetadata(message2);
  MVar8 = Message::GetMetadata(message1);
  name._M_str = "ra";
  name._M_len = 2;
  field = Descriptor::FindFieldByName(MVar8.descriptor,name);
  iVar5 = 0;
  iVar4 = 1;
  while( true ) {
    iVar1 = Reflection::FieldSize(MVar6.reflection,message1,field);
    if (iVar1 <= iVar5) break;
    iVar2 = Reflection::GetRepeatedInt32(MVar6.reflection,message1,field,iVar5);
    iVar4 = iVar4 * iVar2;
    iVar5 = iVar5 + 1;
  }
  iVar1 = 0;
  iVar5 = 1;
  while( true ) {
    iVar3 = Reflection::FieldSize(MVar7.reflection,message2,field);
    if (iVar3 <= iVar1) break;
    iVar2 = Reflection::GetRepeatedInt32(MVar7.reflection,message2,field,iVar1);
    iVar5 = iVar5 * iVar2;
    iVar1 = iVar1 + 1;
  }
  return iVar4 == iVar5;
}

Assistant:

bool IsMatch(const Message& message1, const Message& message2,
               int unpacked_any,
               const std::vector<SpecificField>& parent_fields) const override {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    // FieldDescriptor for item.ra
    const FieldDescriptor* ra_field =
        message1.GetDescriptor()->FindFieldByName("ra");
    // Get the product of all elements in item.ra
    int result1 = 1, result2 = 1;
    for (int i = 0; i < reflection1->FieldSize(message1, ra_field); ++i) {
      result1 *= reflection1->GetRepeatedInt32(message1, ra_field, i);
    }
    for (int i = 0; i < reflection2->FieldSize(message2, ra_field); ++i) {
      result2 *= reflection2->GetRepeatedInt32(message2, ra_field, i);
    }
    return result1 == result2;
  }